

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int I2CGetBit(wfRx_t *w)

{
  int iVar1;
  int bit;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  set_SDA((wfRx_t *)0x1314b3);
  I2C_delay((wfRx_t *)0x1314bd);
  I2C_clock_stretch((wfRx_t *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  iVar1 = read_SDA((wfRx_t *)0x1314d1);
  I2C_delay((wfRx_t *)0x1314df);
  clear_SCL((wfRx_t *)0x1314e9);
  return iVar1;
}

Assistant:

static int I2CGetBit(wfRx_t *w)
{
   int bit;

   set_SDA(w); /* let SDA float */
   I2C_delay(w);
   I2C_clock_stretch(w);
   bit = read_SDA(w);
   I2C_delay(w);
   clear_SCL(w);

   return bit;
}